

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O2

void __thiscall
Commands::command_handler_register_helper::
Register<std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,bool))(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,Command_Source*,bool)>>
          (command_handler_register_helper *this,command_info *info,
          _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_bool))(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*,_bool)>
          *f,int flags)

{
  command_handler_register *this_00;
  function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*)>
  fStack_118;
  command_info local_f8;
  command_handler local_98;
  
  this_00 = command_handler_register_instance;
  command_info::command_info(&local_f8,info);
  std::
  function<void(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,Command_Source*)>
  ::
  function<std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,bool))(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,Command_Source*,bool)>const&,void>
            ((function<void(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,Command_Source*)>
              *)&fStack_118,f);
  command_handler::command_handler(&local_98,&local_f8,&fStack_118);
  command_handler_register::Register(this_00,&local_98,flags);
  command_handler::~command_handler(&local_98);
  std::_Function_base::~_Function_base(&fStack_118.super__Function_base);
  command_info::~command_info(&local_f8);
  return;
}

Assistant:

void Register(command_info info, const F& f, int flags = 0)
		{
			command_handler_register_instance->Register(command_handler(info, std::function<void(const std::vector<std::string>&, Command_Source*)>(f)), flags);
		}